

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O0

upb_MiniTableEnum * create_enumlayout(upb_DefBuilder *ctx,upb_EnumDef *e)

{
  upb_MiniTableEnum *puVar1;
  upb_MiniTableEnum *layout;
  undefined1 auStack_228 [7];
  upb_Status status;
  _Bool ok;
  upb_StringView sv;
  upb_EnumDef *e_local;
  upb_DefBuilder *ctx_local;
  
  status.msg[0x1f7] =
       upb_EnumDef_MiniDescriptorEncode(e,ctx->tmp_arena,(upb_StringView *)(status.msg + 0x1f8));
  if (!(bool)status.msg[0x1f7]) {
    _upb_DefBuilder_Errf(ctx,"OOM while building enum MiniDescriptor");
  }
  puVar1 = upb_MiniTableEnum_Build
                     (stack0xffffffffffffffd8,(size_t)sv.data,ctx->arena,
                      (upb_Status *)((long)&layout + 7));
  if (puVar1 == (upb_MiniTableEnum *)0x0) {
    _upb_DefBuilder_Errf(ctx,"Error building enum MiniTable: %s",auStack_228);
  }
  return puVar1;
}

Assistant:

static upb_MiniTableEnum* create_enumlayout(upb_DefBuilder* ctx,
                                            const upb_EnumDef* e) {
  upb_StringView sv;
  bool ok = upb_EnumDef_MiniDescriptorEncode(e, ctx->tmp_arena, &sv);
  if (!ok) _upb_DefBuilder_Errf(ctx, "OOM while building enum MiniDescriptor");

  upb_Status status;
  upb_MiniTableEnum* layout =
      upb_MiniTableEnum_Build(sv.data, sv.size, ctx->arena, &status);
  if (!layout)
    _upb_DefBuilder_Errf(ctx, "Error building enum MiniTable: %s", status.msg);
  return layout;
}